

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall libchars::editor::print(editor *this)

{
  size_t *psVar1;
  terminal_driver *ptVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  debug *pdVar8;
  ulong uVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar10;
  ulong uVar11;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  size_t sVar12;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  size_t in_RCX;
  size_t __n;
  void *pvVar13;
  ulong uVar14;
  edit_object *peVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  size_t local_78;
  size_t x;
  size_t y;
  ulong local_60;
  ulong local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  this->state = IDLE;
  peVar15 = this->obj;
  if (peVar15->mode == MODE_MULTILINE) {
    if (peVar15->prompt_rendered == 0) {
      terminal_driver::write
                (this->driver,(int)(peVar15->prompt)._M_dataplus._M_p,
                 (void *)(peVar15->prompt)._M_string_length,in_RCX);
      this->obj->prompt_rendered = (this->obj->prompt)._M_string_length;
    }
    peVar15 = this->obj;
    uVar14 = peVar15->cursor;
    pvVar13 = (void *)(peVar15->insert_idx - uVar14);
    if (peVar15->insert_idx < uVar14 || pvVar13 == (void *)0x0) {
      return 0;
    }
    terminal_driver::write(this->driver,(int)peVar15 + (int)uVar14 + 8,pvVar13,uVar14);
    this->obj->cursor = this->obj->insert_idx;
    return 0;
  }
  ptVar2 = this->driver;
  if (ptVar2->control_enabled == false) {
    if (peVar15->prompt_rendered == 0) {
      terminal_driver::write
                (ptVar2,(int)(peVar15->prompt)._M_dataplus._M_p,
                 (void *)(peVar15->prompt)._M_string_length,in_RCX);
      this->obj->prompt_rendered = (this->obj->prompt)._M_string_length;
    }
    peVar15 = this->obj;
    uVar14 = peVar15->cursor;
    if (peVar15->insert_idx <= uVar14) {
      return 0;
    }
    if (peVar15->buflen < uVar14) {
      uVar14 = peVar15->buflen;
    }
    iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar14);
    iVar6 = (*this->obj->_vptr_edit_object[0xc])();
    sVar12 = CONCAT44(extraout_var_00,iVar6) - CONCAT44(extraout_var,iVar5);
    if (this->obj->mode == MODE_PASSWORD) {
      sVar12 = 0;
    }
    if (CONCAT44(extraout_var_00,iVar6) <= CONCAT44(extraout_var,iVar5)) {
      sVar12 = 0;
    }
    sVar12 = render(this,this->obj->cursor,sVar12);
    psVar1 = &this->obj->cursor;
    *psVar1 = *psVar1 + sVar12;
    return 0;
  }
  local_48 = ptVar2->t_cols;
  uVar14 = ptVar2->t_rows;
  if (uVar14 == 0 || local_48 == 0) {
    iVar5 = -2;
  }
  else {
    if (1 < (uVar14 | local_48)) {
      local_40 = uVar14 * local_48 - 1;
      uVar14 = peVar15->insert_idx;
      if (peVar15->buflen < peVar15->insert_idx) {
        uVar14 = peVar15->buflen;
      }
      iVar5 = (*peVar15->_vptr_edit_object[0xd])(peVar15,uVar14);
      uVar9 = CONCAT44(extraout_var_01,iVar5);
      peVar15 = this->obj;
      uVar14 = peVar15->insert_idx;
      if (peVar15->buflen < peVar15->insert_idx) {
        uVar14 = peVar15->buflen;
      }
      iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar14);
      peVar15 = this->obj;
      uVar14 = peVar15->insert_idx + 1;
      if (peVar15->buflen < uVar14) {
        uVar14 = peVar15->buflen;
      }
      iVar6 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar14);
      peVar15 = this->obj;
      if (peVar15->mode == MODE_PASSWORD) {
        local_50 = 0;
      }
      else {
        iVar7 = (*peVar15->_vptr_edit_object[0xc])(peVar15,peVar15->buflen);
        local_50 = CONCAT44(extraout_var_04,iVar7);
      }
      local_38 = CONCAT44(extraout_var_02,iVar5);
      if (uVar9 < CONCAT44(extraout_var_02,iVar5)) {
        local_38 = uVar9;
      }
      uVar14 = CONCAT44(extraout_var_03,iVar6);
      if (CONCAT44(extraout_var_03,iVar6) <= local_38) {
        uVar14 = local_38;
      }
      if (local_40 < uVar9 - local_38) {
        uVar9 = local_38;
      }
      pdVar8 = debug::initialize(0);
      uVar16 = local_38;
      uVar17 = local_40;
      sVar12 = local_50;
      local_60 = uVar14;
      local_58 = uVar9;
      debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (uVar17 < (this->obj->prompt)._M_string_length + sVar12) {
        if (sVar12 == 0) {
          uVar14 = 0;
          uVar9 = 0;
          uVar17 = 0;
        }
        else {
          if (local_60 - uVar16 < uVar17) {
            uVar9 = uVar17 >> 1;
            uVar14 = 0;
            if (uVar9 < sVar12 - local_58) {
              if (uVar9 <= local_58) {
                uVar14 = local_58 - uVar9;
              }
            }
            else if (uVar17 <= sVar12) {
              uVar14 = sVar12 - uVar17;
            }
            pdVar8 = debug::initialize(0);
            uVar9 = local_38;
            dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            uVar16 = uVar9 - uVar14;
            if (uVar9 < uVar14 || uVar16 == 0) {
              sVar19 = this->obj->insert_idx;
              uVar17 = local_40;
            }
            else {
              peVar15 = this->obj;
              local_48 = peVar15->insert_idx;
              sVar19 = 0;
              if (uVar16 <= local_48) {
                sVar19 = local_48 - uVar16;
              }
              uVar9 = peVar15->buflen;
              if (sVar19 <= peVar15->buflen) {
                uVar9 = sVar19;
              }
              iVar5 = (*peVar15->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar15,uVar9);
              uVar17 = local_40;
              local_38 = CONCAT44(extraout_var_05,iVar5);
              if (uVar14 < local_38) {
                uVar9 = local_38;
                if (uVar16 < local_48) {
                  if (local_48 < uVar16) {
                    uVar16 = local_48;
                  }
                  uVar17 = ~uVar16 + local_48;
                  do {
                    sVar19 = uVar17;
                    peVar15 = this->obj;
                    uVar9 = peVar15->buflen;
                    if (sVar19 <= peVar15->buflen) {
                      uVar9 = sVar19;
                    }
                    iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar9);
                    uVar9 = CONCAT44(extraout_var_06,iVar5);
                  } while ((sVar19 != 0) && (uVar17 = sVar19 - 1, uVar14 < uVar9));
                }
                local_38 = uVar9;
                uVar17 = local_40;
                if (local_38 < uVar14) {
                  sVar19 = sVar19 + 1;
                  peVar15 = this->obj;
                  uVar14 = peVar15->buflen;
                  if (sVar19 <= peVar15->buflen) {
                    uVar14 = sVar19;
                  }
                  iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar14);
                  local_38 = CONCAT44(extraout_var_07,iVar5);
                  uVar17 = local_40;
                }
              }
              else if ((local_38 < uVar14) && (peVar15 = this->obj, sVar19 < peVar15->insert_idx)) {
                do {
                  sVar19 = sVar19 + 1;
                  uVar9 = peVar15->buflen;
                  if (sVar19 <= peVar15->buflen) {
                    uVar9 = sVar19;
                  }
                  iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar9);
                  local_38 = CONCAT44(extraout_var_13,iVar5);
                } while ((local_38 < uVar14) && (peVar15 = this->obj, sVar19 < peVar15->insert_idx))
                ;
              }
            }
          }
          else {
            sVar19 = this->obj->insert_idx;
          }
          pdVar8 = debug::initialize(0);
          uVar14 = local_38;
          dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          y = uVar14 + uVar17;
          if (y < sVar12) {
            sVar12 = y;
          }
          peVar15 = this->obj;
          uVar14 = peVar15->insert_idx;
          if (peVar15->insert_idx <= sVar19) {
            uVar14 = sVar19;
          }
          uVar9 = uVar14 + 1;
          if (peVar15->buflen < uVar14 + 1) {
            uVar9 = peVar15->buflen;
          }
          local_48 = sVar19;
          iVar5 = (*peVar15->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar15,uVar9);
          uVar16 = CONCAT44(extraout_var_08,iVar5);
          pdVar8 = debug::initialize(0);
          uVar14 = local_60;
          dVar3 = debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          lVar10 = sVar12 - uVar14;
          uVar9 = local_48;
          uVar17 = local_38;
          if (uVar14 <= sVar12 && lVar10 != 0) {
            peVar15 = this->obj;
            uVar11 = lVar10 + peVar15->insert_idx;
            uVar14 = peVar15->buflen;
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            uVar9 = uVar11 + 1;
            if (uVar14 < uVar11 + 1) {
              uVar9 = uVar14;
            }
            iVar5 = (*peVar15->_vptr_edit_object[0xc])(SUB84(dVar3,0),peVar15,uVar9);
            uVar17 = local_38;
            uVar9 = local_48;
            uVar16 = CONCAT44(extraout_var_09,iVar5);
            local_50 = sVar12;
            if (uVar16 < sVar12) {
              peVar15 = this->obj;
              uVar14 = peVar15->buflen;
              uVar18 = uVar11;
              if (uVar11 < uVar14) {
                do {
                  uVar11 = uVar18 + 1;
                  uVar16 = uVar18 + 2;
                  if (uVar14 < uVar18 + 2) {
                    uVar16 = uVar14;
                  }
                  iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar16);
                  uVar16 = CONCAT44(extraout_var_10,iVar5);
                  peVar15 = this->obj;
                  uVar14 = peVar15->buflen;
                } while ((uVar16 < local_50) && (uVar18 = uVar11, uVar11 < uVar14));
              }
              if ((local_50 < uVar16) && (peVar15->insert_idx < uVar11)) {
                local_50 = uVar11 - 1;
                if (uVar14 < uVar11) {
                  uVar11 = uVar14;
                }
                iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar11);
                uVar16 = CONCAT44(extraout_var_11,iVar5);
              }
            }
            else if (sVar12 < uVar16) {
              do {
                peVar15 = this->obj;
                if (uVar11 <= peVar15->insert_idx) break;
                uVar14 = uVar11;
                if (peVar15->buflen < uVar11) {
                  uVar14 = peVar15->buflen;
                }
                iVar5 = (*peVar15->_vptr_edit_object[0xc])(peVar15,uVar14);
                uVar16 = CONCAT44(extraout_var_12,iVar5);
                uVar11 = uVar11 - 1;
              } while (local_50 < uVar16);
            }
          }
          sVar12 = y;
          if (uVar16 - uVar17 <= local_40) {
            sVar12 = uVar16;
          }
          uVar14 = 0;
          if (uVar17 <= uVar16) {
            uVar14 = sVar12 - uVar17;
          }
          local_38 = uVar17;
          pdVar8 = debug::initialize(0);
          uVar17 = local_38;
          debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
        }
        ptVar2 = this->driver;
        terminal_driver::cursor_disable(ptVar2);
        terminal_driver::clear_screen(this->driver);
        pvVar13 = (void *)(local_40 - uVar14);
        if (local_40 < uVar14 || pvVar13 == (void *)0x0) {
          this->obj->prompt_rendered = 0;
          uVar14 = local_40;
        }
        else {
          peVar15 = this->obj;
          peVar15->prompt_rendered = (size_t)pvVar13;
          terminal_driver::write
                    (this->driver,
                     ((int)(peVar15->prompt)._M_dataplus._M_p +
                     (int)(peVar15->prompt)._M_string_length) - (int)pvVar13,pvVar13,local_40);
          pdVar8 = debug::initialize(0);
          debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
        }
        sVar12 = render(this,uVar9,uVar14);
        pdVar8 = debug::initialize(0);
        debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
        iVar5 = terminal_driver::set_new_xy(this->driver,local_58 - (uVar17 + sVar12));
        terminal_driver::cursor_enable(ptVar2);
        if (iVar5 < 0) {
          iVar5 = -1;
          goto LAB_001107f8;
        }
      }
      else {
        bVar4 = false;
        pdVar8 = debug::initialize(0);
        __n = 0x143;
        debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        iVar6 = terminal_driver::set_new_xy
                          (this->driver,-(this->obj->cursor + this->obj->prompt_rendered));
        iVar5 = -1;
        if (iVar6 < 0) goto LAB_001107fb;
        terminal_driver::clear_to_end_of_screen(this->driver);
        pvVar13 = (void *)(this->obj->prompt)._M_string_length;
        if (pvVar13 != (void *)0x0) {
          terminal_driver::write(this->driver,(int)(this->obj->prompt)._M_dataplus._M_p,pvVar13,__n)
          ;
          pdVar8 = debug::initialize(0);
          debug::log(pdVar8,(double)this->obj->cursor);
          this->obj->cursor = 0;
        }
        this->obj->prompt_rendered = (this->obj->prompt)._M_string_length;
        if (sVar12 == 0) {
          uVar14 = 0;
        }
        else {
          ptVar2 = this->driver;
          terminal_driver::cursor_disable(ptVar2);
          sVar12 = render(this,0,sVar12);
          pdVar8 = debug::initialize(0);
          debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
          if ((this->obj->prompt_rendered + sVar12) % local_48 == 0) {
            terminal_driver::newline(this->driver);
          }
          iVar6 = terminal_driver::set_new_xy(this->driver,local_58 - sVar12);
          terminal_driver::cursor_enable(ptVar2);
          uVar14 = 1;
          if (iVar6 < 0) goto LAB_001107f8;
        }
      }
      sVar12 = local_58;
      if (uVar14 == 0) {
        sVar12 = 0;
      }
      this->obj->cursor = sVar12;
      pdVar8 = debug::initialize(0);
      iVar5 = -1;
      bVar4 = true;
      if ((3 < pdVar8->log_level) && (this->driver->control_enabled == true)) {
        terminal_driver::cursor_position(this->driver,&local_78,&x,-1);
        pdVar8 = debug::initialize(0);
        debug::log(pdVar8,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      }
      goto LAB_001107fb;
    }
    iVar5 = -3;
  }
LAB_001107f8:
  bVar4 = false;
LAB_001107fb:
  if (bVar4) {
    return 0;
  }
  return iVar5;
}

Assistant:

int editor::print()
    {
        state = IDLE;

        if (obj->mode == MODE_MULTILINE) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // print from previous cursor up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t n_to_write = (obj->insert_idx - obj->cursor);
                driver.write(obj->data() + obj->cursor, n_to_write);
                obj->cursor = obj->insert_idx;
            }
        }
        else if (!driver.control()) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // render from previous position up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t start = obj->terminal_idx(obj->idx(obj->cursor));
                size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));
                size_t render_length = (obj->mode == MODE_PASSWORD || end <= start) ? 0 : (end - start);
                obj->cursor += render(obj->cursor,render_length);
            }
        } 
        else {
          size_t cols = driver.columns();
          size_t rows = driver.rows();

          // invalid: no rows or columns
          if (cols == 0 || rows == 0)
              return -2;
          // do nothing if only 1 position available (1 x 1 terminal)
          if (cols <= 1 && rows <= 1)
              return -3;

          // calculate available terminal space (leave extra space at the end for the cursor to overflow into)
          size_t window = cols * rows - 1;

          // dump will be limited depending on available terminal space;
          // prompt will be shortened if terminal not big enough for full string

          size_t cursor = obj->terminal_cursor(obj->idx(obj->insert_idx));
          size_t start = obj->terminal_idx(obj->idx(obj->insert_idx));
          size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));

          size_t render_length = (obj->mode == MODE_PASSWORD) ? 0 : obj->terminal_idx(obj->idx(obj->length()));

          if (cursor < start)
              start = cursor;
          if (end < start)
              end = start;
          if ((cursor - start) > window)
              cursor = start;

          LC_LOG_VERBOSE("window[%zu:%zux%zu];start[%zu];cursor[%zu];end[%zu];render_len[%zu]",window,cols,rows,start,cursor,end,render_length);

          if ((render_length + obj->prompt.length()) > window) {
              size_t idx_from = 0;
              size_t from = 0;
              if (render_length > 0) {
                  if ((end - start) >= window) {
                      idx_from = obj->insert_idx;
                      from = start;
                  }
                  else {
                      size_t search_from = 0;
                      if ((render_length - cursor) <= window/2) { // <-- cursor in last 1/2 window
                          // find all complete expanded characters that fit into (window - (LENGTH - START)) before START
                          if (render_length > window)
                              search_from = render_length - window;
                          else
                              search_from = 0;
                      }
                      else if (cursor < window/2) { // <-- cursor in first 1/2 window
                          // find all complete expanded characters that fit into space before START
                          search_from = 0;
                      }
                      else {
                          search_from = cursor - window/2;
                      }
                      LC_LOG_VERBOSE("search_from[%zu];start[%zu]",search_from,start);

                      if (search_from < start) {
                          // start searching with assumption that render is 1:1 with buffer
                          size_t space = start - search_from;
                          if (space < obj->insert_idx)
                              idx_from = obj->insert_idx - space;
                          else
                              idx_from = 0;
                          // keep on comparing until rendered string fits in or until space runs out
                          from = obj->terminal_idx(obj->idx(idx_from));
                          if (from > search_from) {
                              // more space available; search backwards
                              while (idx_from > 0 && from > search_from) {
                                  --idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                              if (from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                          else if (from < search_from) {
                              // used too much space; search forwards
                              while (idx_from < obj->insert_idx && from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                      }
                      else {
                          idx_from = obj->insert_idx;
                          from = start;
                      }
                  }

                  LC_LOG_VERBOSE("from[%zu];idx_from[%zu]",from,idx_from);

                  // find all expanded characters (even partial) that fit into (window - END) on and after END
                  size_t search_to = from + window;
                  if (search_to > render_length)
                      search_to = render_length;
                  size_t idx_to = obj->insert_idx;
                  if (idx_to < idx_from)
                      idx_to = idx_from;
                  size_t to = obj->terminal_idx(obj->idx(idx_to + 1));

                  LC_LOG_VERBOSE("search_to[%zu];end[%zu]",search_to,end);

                  if (search_to > end) {
                      // start searching with assumption that render is 1:1 with buffer
                      idx_to = obj->idx(obj->insert_idx + (search_to - end));
                      // keep on comparing until rendered string fits in or until space runs out
                      to = obj->terminal_idx(obj->idx(idx_to + 1));
                      if (to < search_to) {
                          // more space available; search forwards
                          while (idx_to < obj->length() && to < search_to) {
                              ++idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                          if (to > search_to && idx_to > obj->insert_idx) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                      else if (to > search_to) {
                          // used too much space; search backwards
                          while (idx_to > obj->insert_idx && to > search_to) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                  }

                  LC_LOG_VERBOSE("to[%zu];idx_to[%zu]",to,idx_to);

                  if (to < from)
                      to = from;
                  else if ((to - from) > window)
                      to = from + window;

                  render_length = to - from;
              }

              // start printing in upper-left corner
              terminal_driver::auto_cursor __(driver);
              driver.clear_screen();

              // print partial prompt (if possible)
              if (render_length < window) {
                  obj->prompt_rendered = window - render_length;
                  driver.write(obj->prompt.data() + obj->prompt.length() - obj->prompt_rendered, obj->prompt_rendered);
                  LC_LOG_VERBOSE("prompt_rendered[%zu]:%s",obj->prompt_rendered,obj->prompt.c_str()+obj->prompt.length()-obj->prompt_rendered);
              }
              else {
                  obj->prompt_rendered = 0;
                  render_length = window;
              }

              // print line[idx_from..]
              size_t rendered = render(idx_from, render_length);
              // move to final cursor position (relative to current position)
              LC_LOG_VERBOSE("cursor[%zu];from[%zu];rendered[%zu]",cursor,from,rendered);
              if (driver.set_new_xy((ssize_t)cursor - (ssize_t)(from + rendered)) < 0)
                  return -1;
          }
          else {
              LC_LOG_VERBOSE("obj->cursor[%zu]",obj->cursor);

              // move cursor to start of prompt position (relative to current position)
              if (driver.set_new_xy(0 - (ssize_t)obj->cursor - (ssize_t)obj->prompt_rendered) < 0)
                  return -1;

              // clear area for printing (TODO: optimize by only clearing specific lines)
              driver.clear_to_end_of_screen();

              // render prompt
              if (obj->prompt.length() > 0) {
                  driver.write(obj->prompt.data(), obj->prompt.length());
                  LC_LOG_VERBOSE("cursor[%zu];prompt_rendered[%zu]",obj->cursor,obj->prompt_rendered);
                  obj->cursor = 0;
              }
              obj->prompt_rendered = obj->prompt.length();

              if (render_length > 0) {
                  // print line
                  terminal_driver::auto_cursor __(driver);
                  size_t rendered = render(0, render_length);
                  LC_LOG_VERBOSE("rendered[%zu]",rendered);

                  // hack to convince cursor to move to the start of the next line
                  // on a fully populated rendered line
                  if (((obj->prompt_rendered + rendered) % cols) == 0)
                      driver.newline();

                  // move to final cursor position (relative to current position)
                  if (driver.set_new_xy((ssize_t)cursor - (ssize_t)rendered) < 0)
                      return -1;
              }
          }

          obj->cursor = (render_length > 0) ? cursor : 0;

          if (LC_LOG_CHECK_LEVEL(debug::VERBOSE) && driver.control()) {
              size_t x,y;
              driver.cursor_position(x,y);
              LC_LOG_VERBOSE("obj->cursor[%zu];x[%zu],y[%zu]",obj->cursor,x,y);
          }
        }

        return 0;
    }